

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void pbrt::VolPathIntegrator::rescale
               (SampledSpectrum *beta,SampledSpectrum *pdfLight,SampledSpectrum *pdfUni)

{
  SampledSpectrum *in_RSI;
  undefined8 in_RDI;
  Float FVar1;
  Float a;
  
  a = (Float)((ulong)in_RDI >> 0x20);
  FVar1 = SampledSpectrum::MaxComponentValue(in_RSI);
  if (((16777216.0 < FVar1) ||
      (FVar1 = SampledSpectrum::MaxComponentValue(in_RSI), 16777216.0 < FVar1)) ||
     (FVar1 = SampledSpectrum::MaxComponentValue(in_RSI), 16777216.0 < FVar1)) {
    SampledSpectrum::operator*=(pdfUni,a);
    SampledSpectrum::operator*=(pdfUni,a);
    SampledSpectrum::operator*=(pdfUni,a);
  }
  else {
    FVar1 = SampledSpectrum::MaxComponentValue(in_RSI);
    if (((FVar1 < 5.9604645e-08) ||
        (FVar1 = SampledSpectrum::MaxComponentValue(in_RSI), FVar1 < 5.9604645e-08)) ||
       (FVar1 = SampledSpectrum::MaxComponentValue(in_RSI), FVar1 < 5.9604645e-08)) {
      SampledSpectrum::operator*=(pdfUni,a);
      SampledSpectrum::operator*=(pdfUni,a);
      SampledSpectrum::operator*=(pdfUni,a);
    }
  }
  return;
}

Assistant:

static void rescale(SampledSpectrum &beta, SampledSpectrum &pdfLight,
                        SampledSpectrum &pdfUni) {
        if (beta.MaxComponentValue() > 0x1p24f ||
            pdfLight.MaxComponentValue() > 0x1p24f ||
            pdfUni.MaxComponentValue() > 0x1p24f) {
            beta *= 1.f / 0x1p24f;
            pdfLight *= 1.f / 0x1p24f;
            pdfUni *= 1.f / 0x1p24f;
        } else if (beta.MaxComponentValue() < 0x1p-24f ||
                   pdfLight.MaxComponentValue() < 0x1p-24f ||
                   pdfUni.MaxComponentValue() < 0x1p-24f) {
            beta *= 0x1p24f;
            pdfLight *= 0x1p24f;
            pdfUni *= 0x1p24f;
        }
    }